

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::PyiGenerator::PrintImportForDescriptor
          (PyiGenerator *this,FileDescriptor *desc,
          flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *seen_aliases,bool *has_importlib)

{
  Printer *pPVar1;
  string_view pc;
  string_view module_name_00;
  bool bVar2;
  AlphaNum *pAVar3;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  this_00;
  bool *pbVar4;
  AlphaNum *in_R9;
  undefined1 auVar5 [16];
  basic_string_view<char,_std::char_traits<char>_> pc_00;
  iterator iVar6;
  string_view filename_00;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_380;
  string_view local_368;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  AlphaNum local_348;
  AlphaNum local_318;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  AlphaNum local_2d8;
  AlphaNum local_2a8;
  string local_278;
  size_t local_258;
  size_t sStack_250;
  AlphaNum local_248;
  AlphaNum local_218;
  string local_1e8;
  undefined1 local_1c8 [8];
  string import_statement;
  string_view local_198;
  size_t local_188;
  size_t sStack_180;
  AlphaNum local_170;
  iterator local_140;
  iterator local_130;
  AlphaNum *local_120;
  char *local_118;
  AlphaNum local_110;
  AlphaNum local_d0;
  undefined1 local_a0 [8];
  string alias;
  size_t last_dot_pos;
  string_view module_name;
  undefined1 local_58 [8];
  string module_name_owned;
  string_view filename;
  bool *has_importlib_local;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *seen_aliases_local;
  FileDescriptor *desc_local;
  PyiGenerator *this_local;
  
  pbVar4 = has_importlib;
  join_0x00000010_0x00000000_ = FileDescriptor::name(desc);
  module_name._M_str = (char *)module_name_owned.field_2._8_8_;
  filename_00._M_str = pbVar4;
  filename_00._M_len = filename._M_len;
  StrippedModuleName_abi_cxx11_
            ((string *)local_58,(python *)module_name_owned.field_2._8_8_,filename_00);
  auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  module_name._M_len = auVar5._8_8_;
  last_dot_pos = auVar5._0_8_;
  alias.field_2._8_8_ =
       std::basic_string_view<char,_std::char_traits<char>_>::rfind
                 ((basic_string_view<char,_std::char_traits<char>_> *)&last_dot_pos,'.',
                  0xffffffffffffffff);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,"_");
  pc_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&last_dot_pos,
                     alias.field_2._8_8_ + 1,0xffffffffffffffff);
  local_118 = pc_00._M_str;
  pAVar3 = (AlphaNum *)pc_00._M_len;
  local_120 = pAVar3;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_110,pc_00);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_a0,(lts_20250127 *)&local_d0,&local_110,pAVar3);
  while( true ) {
    iVar6 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
            ::find<std::__cxx11::string>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                        *)seen_aliases,(key_arg<std::__cxx11::basic_string<char>_> *)local_a0);
    local_130 = iVar6;
    iVar6 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&seen_aliases->
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
    local_140.field_1 = iVar6.field_1;
    pAVar3 = (AlphaNum *)iVar6.ctrl_;
    local_140.ctrl_ = (ctrl_t *)pAVar3;
    bVar2 = absl::lts_20250127::container_internal::operator!=(&local_130,&local_140);
    if (!bVar2) break;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_170,"_1");
    absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_a0,&local_170);
  }
  local_188 = last_dot_pos;
  sStack_180 = module_name._M_len;
  module_name_00._M_str = (char *)module_name._M_len;
  module_name_00._M_len = last_dot_pos;
  bVar2 = ContainsPythonKeyword(module_name_00);
  if (bVar2) {
    if ((*has_importlib & 1U) == 0) {
      pPVar1 = this->printer_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_198,"import importlib\n");
      io::Printer::Print<>(pPVar1,local_198);
      *has_importlib = true;
    }
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&import_statement.field_2 + 8),
               "$alias$ = importlib.import_module(\'$name$\')\n");
    io::Printer::
    Print<char[6],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>>
              (pPVar1,stack0xfffffffffffffe58,(char (*) [6])0xa1411c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               (char (*) [5])0xc259cc,
               (basic_string_view<char,_std::char_traits<char>_> *)&last_dot_pos);
  }
  else {
    std::__cxx11::string::string((string *)local_1c8);
    if (alias.field_2._8_8_ == -1) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_218,"import ");
      local_258 = last_dot_pos;
      sStack_250 = module_name._M_len;
      pc._M_str = (char *)module_name._M_len;
      pc._M_len = last_dot_pos;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_248,pc);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_1e8,(lts_20250127 *)&local_218,&local_248,pAVar3)
      ;
      std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_2a8,"from ");
      local_2e8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&last_dot_pos,0,
                             alias.field_2._8_8_);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,local_2e8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_318," import ");
      local_358 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&last_dot_pos,
                             alias.field_2._8_8_ + 1,0xffffffffffffffff);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_348,local_358);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_278,(lts_20250127 *)&local_2a8,&local_2d8,&local_318,&local_348,in_R9);
      std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
    }
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_368,"$statement$ as $alias$\n");
    io::Printer::Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string>
              (pPVar1,local_368,(char (*) [10])"statement",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
               (char (*) [6])0xa1411c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    this_00 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::
              operator[]<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&this->import_map_,
                         (key_arg<std::basic_string_view<char>_> *)
                         ((long)&module_name_owned.field_2 + 8));
    std::__cxx11::string::operator=((string *)this_00,(string *)local_a0);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_380,
               &seen_aliases->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::~string((string *)local_1c8);
  }
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void PyiGenerator::PrintImportForDescriptor(
    const FileDescriptor& desc, absl::flat_hash_set<std::string>* seen_aliases,
    bool* has_importlib) const {
  const absl::string_view filename = desc.name();
  std::string module_name_owned = StrippedModuleName(filename);
  absl::string_view module_name(module_name_owned);
  size_t last_dot_pos = module_name.rfind('.');
  std::string alias = absl::StrCat("_", module_name.substr(last_dot_pos + 1));
  // Generate a unique alias by adding _1 suffixes until we get an unused alias.
  while (seen_aliases->find(alias) != seen_aliases->end()) {
    absl::StrAppend(&alias, "_1");
  }
  if (ContainsPythonKeyword(module_name)) {
    if (*has_importlib == false) {
      printer_->Print("import importlib\n");
      *has_importlib = true;
    }
    printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                    alias, "name", module_name);
  } else {
    std::string import_statement;
    if (last_dot_pos == std::string::npos) {
      import_statement = absl::StrCat("import ", module_name);
    } else {
      import_statement =
          absl::StrCat("from ", module_name.substr(0, last_dot_pos), " import ",
                       module_name.substr(last_dot_pos + 1));
    }
    printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                    "alias", alias);
    import_map_[filename] = alias;
    seen_aliases->insert(alias);
  }
}